

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int count_cols(MATRIX *matrix,int n,int j)

{
  long lVar1;
  int iVar2;
  pointer pvVar3;
  bool bVar4;
  
  pvVar3 = (matrix->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar1 = ((long)(matrix->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
  iVar2 = 0;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    iVar2 = iVar2 + (uint)(*(int *)(*(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data + (long)j * 4) == n)
    ;
    pvVar3 = pvVar3 + 1;
  }
  return iVar2;
}

Assistant:

int count_cols(MATRIX &matrix, int n, int j){
    int n_columns=0;
    for(int i=0; i<matrix.size(); i++){
        if (matrix[i][j]==n){
            n_columns++;
        }
    }
    return n_columns;
}